

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

void tree_sitter_c_sharp_external_scanner_deserialize(void *payload,char *buffer,uint length)

{
  uint uVar1;
  char local_38;
  char cStack_37;
  char cStack_36;
  undefined1 uStack_35;
  uint uStack_34;
  Interpolation interpolation;
  uint i;
  uint size;
  Scanner *scanner;
  uint length_local;
  char *buffer_local;
  void *payload_local;
  
  *(undefined1 *)payload = 0;
  *(undefined4 *)((long)payload + 0x10) = 0;
  interpolation.string_type = 0;
  if (length != 0) {
    *(char *)payload = *buffer;
    interpolation.string_type = VERBATIM;
    *(uint *)((long)payload + 0x10) = (uint)(byte)buffer[1];
    _array__reserve((Array *)((long)payload + 8),8,*(uint32_t *)((long)payload + 0x10));
    interpolation.dollar_count = '\0';
    interpolation.open_brace_count = '\0';
    interpolation.quote_count = '\0';
    interpolation._3_1_ = 0;
    for (; (uint)interpolation._0_4_ < *(uint *)((long)payload + 0x10);
        interpolation._0_4_ = interpolation._0_4_ + 1) {
      memset(&local_38,0,8);
      local_38 = buffer[interpolation.string_type];
      cStack_37 = buffer[interpolation.string_type + REGULAR];
      uVar1 = interpolation.string_type + (VERBATIM|REGULAR);
      cStack_36 = buffer[interpolation.string_type + VERBATIM];
      interpolation.string_type = interpolation.string_type + RAW;
      uStack_34 = (uint)(byte)buffer[uVar1];
      *(ulong *)(*(long *)((long)payload + 8) + (ulong)(uint)interpolation._0_4_ * 8) =
           (ulong)CONCAT14(buffer[uVar1],
                           CONCAT13(uStack_35,CONCAT12(cStack_36,CONCAT11(cStack_37,local_38))));
    }
  }
  if (interpolation.string_type != length) {
    __assert_fail("size == length",
                  "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-c-sharp/src/scanner.c"
                  ,0x6b,
                  "void tree_sitter_c_sharp_external_scanner_deserialize(void *, const char *, unsigned int)"
                 );
  }
  return;
}

Assistant:

void tree_sitter_c_sharp_external_scanner_deserialize(void *payload, const char *buffer, unsigned length) {
    Scanner *scanner = (Scanner *)payload;

    scanner->quote_count = 0;
    array_clear(&scanner->interpolation_stack);
    unsigned size = 0;

    if (length > 0) {
        scanner->quote_count = (unsigned char)buffer[size++];
        scanner->interpolation_stack.size = (unsigned char)buffer[size++];
        array_reserve(&scanner->interpolation_stack, scanner->interpolation_stack.size);

        for (unsigned i = 0; i < scanner->interpolation_stack.size; i++) {
            Interpolation interpolation = {0};
            interpolation.dollar_count = buffer[size++];
            interpolation.open_brace_count = buffer[size++];
            interpolation.quote_count = buffer[size++];
            interpolation.string_type = (unsigned char)buffer[size++];
            scanner->interpolation_stack.contents[i] = interpolation;
        }
    }

    assert(size == length);
}